

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_tests2.cpp
# Opt level: O2

void __thiscall
pkg1::iu_PackageTestFixed_x_iutest_x_B_Test::Body(iu_PackageTestFixed_x_iutest_x_B_Test *this)

{
  TestSuite *pTVar1;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  pTVar1 = iuutil::GetCurrentTestSuite();
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)"\"pkg1\" \".\" \"PackageTestFixed\"",
             "::iuutil::GetCurrentTestSuite()->name()","pkg1.PackageTestFixed",
             (pTVar1->m_testsuite_name)._M_dataplus._M_p,
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/package_tests2.cpp"
               ,0x1e,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_F(PackageTestFixed, B)
    {
        IUTEST_EXPECT_PACKAGENAME(pkg1, PackageTestFixed);
    }